

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * __thiscall Pathie::Path::operator/=(Path *this,string *str)

{
  pointer pcVar1;
  string local_60;
  Path local_40;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + str->_M_string_length);
  join(&local_40,this,&local_60);
  if (&local_40 != this) {
    std::__cxx11::string::_M_assign((string *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_path._M_dataplus._M_p != &local_40.m_path.field_2) {
    operator_delete(local_40.m_path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return this;
}

Assistant:

Path& Path::operator/=(std::string str)
{
  *this = join(str);
  return *this;
}